

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.hpp
# Opt level: O3

bool __thiscall sglr::rc::TextureCube::isComplete(TextureCube *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  int *piVar10;
  uint uVar11;
  size_t *psVar12;
  long lVar13;
  
  uVar1 = (this->super_Texture).m_baseLevel;
  uVar6 = (ulong)uVar1;
  if ((0xd < uVar6) || (this->m_levels[0].m_data[uVar6].m_cap == 0)) {
    return false;
  }
  uVar2 = this->m_levels[0].m_access[uVar6].super_ConstPixelBufferAccess.m_size.m_data[0];
  uVar3 = this->m_levels[0].m_access[uVar6].super_ConstPixelBufferAccess.m_size.m_data[1];
  uVar9 = 1;
  if (LINEAR < (this->super_Texture).m_sampler.minFilter) {
    uVar5 = ((this->super_Texture).m_maxLevel - uVar1) + 1;
    uVar9 = uVar3;
    if ((int)uVar3 < (int)uVar2) {
      uVar9 = uVar2;
    }
    uVar11 = 0x20;
    if (uVar9 != 0) {
      uVar11 = 0x1f;
      if (uVar9 != 0) {
        for (; uVar9 >> uVar11 == 0; uVar11 = uVar11 - 1) {
        }
      }
      uVar11 = uVar11 ^ 0x1f;
    }
    uVar9 = 0x20 - uVar11;
    if ((int)uVar5 < (int)(0x20 - uVar11)) {
      uVar9 = uVar5;
    }
  }
  bVar4 = false;
  if (uVar2 == uVar3) {
    if ((int)uVar9 < 1) {
      uVar7 = 0;
    }
    else {
      psVar12 = &this->m_levels[0].m_data[uVar6].m_cap;
      piVar10 = this->m_levels[0].m_access[uVar6].super_ConstPixelBufferAccess.m_size.m_data + 1;
      uVar7 = 0;
      do {
        iVar8 = (int)uVar2 >> ((byte)uVar7 & 0x1f);
        if (iVar8 < 2) {
          iVar8 = 1;
        }
        if (uVar7 == 0xe - uVar1) {
          return false;
        }
        lVar13 = 0;
        do {
          if (*(long *)((long)psVar12 + lVar13) == 0) {
            return false;
          }
          if (*(int *)((long)piVar10 + lVar13 + -4) != iVar8) {
            return false;
          }
          if (*(int *)((long)piVar10 + lVar13) != iVar8) {
            return false;
          }
          if (*(ChannelOrder *)((long)piVar10 + lVar13 + -0xc) !=
              this->m_levels[0].m_access[uVar6].super_ConstPixelBufferAccess.m_format.order) {
            return false;
          }
          if (*(ChannelType *)((long)piVar10 + lVar13 + -8) !=
              this->m_levels[0].m_access[uVar6].super_ConstPixelBufferAccess.m_format.type) {
            return false;
          }
          lVar13 = lVar13 + 0x540;
        } while (lVar13 != 0x1f80);
        uVar7 = uVar7 + 1;
        psVar12 = psVar12 + 2;
        piVar10 = piVar10 + 10;
      } while (uVar7 != uVar9);
    }
    bVar4 = (long)(int)uVar9 <= (long)uVar7;
  }
  return bVar4;
}

Assistant:

int							getMaxLevel		(void) const	{ return m_maxLevel;		}